

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Validity * __thiscall
capnp::compiler::CompilerMain::addOutput
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr spec)

{
  size_t __n;
  long lVar1;
  RemoveConst<capnp::compiler::CompilerMain::OutputDirective> **ppRVar2;
  OutputDirective *pOVar3;
  OutputDirective *pOVar4;
  RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *pRVar5;
  String *pSVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  void *pvVar10;
  undefined4 extraout_var;
  ulong uVar11;
  char *__s;
  ulong uVar12;
  char *__file;
  size_t sVar13;
  StringPtr pathText;
  stat stats;
  Path local_168;
  Validity *local_150;
  undefined1 local_148 [16];
  Maybe<kj::Path> local_138;
  Maybe<kj::Path> local_110;
  Maybe<kj::Path> local_f0;
  PathPtr local_d0;
  undefined1 local_c0 [16];
  Maybe<kj::Path> local_b0 [4];
  
  __s = spec.content.ptr;
  __n = spec.content.size_ - 1;
  pvVar10 = memchr(__s,0x3a,__n);
  if (pvVar10 == (void *)0x0) {
    local_110.ptr.isSet = false;
    local_c0._0_8_ = __s;
    local_c0._8_8_ = __n;
    kj::Maybe<kj::Path>::Maybe(local_b0,&local_110);
    pOVar3 = (this->outputs).builder.endPtr;
    if ((this->outputs).builder.pos == pOVar3) {
      pOVar4 = (this->outputs).builder.ptr;
      sVar13 = 4;
      if (pOVar3 != pOVar4) {
        sVar13 = ((long)pOVar3 - (long)pOVar4 >> 4) * 0x5555555555555556;
      }
      kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::setCapacity(&this->outputs,sVar13)
      ;
    }
    pRVar5 = (this->outputs).builder.pos;
    (pRVar5->name).ptr = (char *)local_c0._0_8_;
    (pRVar5->name).size_ = local_c0._8_8_;
    kj::Maybe<kj::Path>::Maybe(&pRVar5->dir,local_b0);
    uVar8 = local_b0[0].ptr.field_1.value.parts.size_;
    uVar7 = local_b0[0].ptr.field_1.value.parts.ptr;
    ppRVar2 = &(this->outputs).builder.pos;
    *ppRVar2 = *ppRVar2 + 1;
    if ((local_b0[0].ptr.isSet == true) &&
       ((String *)local_b0[0].ptr.field_1._0_8_ != (String *)0x0)) {
      local_b0[0].ptr.field_1.value.parts.ptr = (String *)0x0;
      local_b0[0].ptr.field_1.value.parts.size_ = 0;
      (**((ArrayDisposer *)local_b0[0].ptr.field_1._16_8_)->_vptr_ArrayDisposer)
                (local_b0[0].ptr.field_1.value.parts.disposer,uVar7,0x18,uVar8,uVar8,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
    }
    uVar8 = local_110.ptr.field_1.value.parts.size_;
    uVar7 = local_110.ptr.field_1.value.parts.ptr;
    if ((local_110.ptr.isSet == true) && (local_110.ptr.field_1.value.parts.ptr != (String *)0x0)) {
      local_110.ptr.field_1.value.parts.ptr = (String *)0x0;
      local_110.ptr.field_1.value.parts.size_ = 0;
      (**(local_110.ptr.field_1.value.parts.disposer)->_vptr_ArrayDisposer)
                (local_110.ptr.field_1.value.parts.disposer,uVar7,0x18,uVar8,uVar8,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
    }
  }
  else {
    uVar12 = (long)pvVar10 - (long)__s;
    __file = (char *)((long)pvVar10 + 1);
    sVar13 = ~uVar12 + spec.content.size_;
    uVar11 = uVar12;
    local_150 = __return_storage_ptr__;
    if (((uVar12 == 1) && (sVar13 - 1 != 0)) && ((*__file == '/' || (*__file == '\\')))) {
      pvVar10 = memchr(__file,0x3a,sVar13 - 1);
      lVar1 = (long)pvVar10 + (1 - (long)__file);
      uVar11 = (long)pvVar10 + (2 - (long)__file);
      if (pvVar10 == (void *)0x0) {
        lVar1 = 0;
        uVar11 = uVar12;
      }
      __file = __file + lVar1;
      sVar13 = sVar13 - lVar1;
    }
    iVar9 = stat64(__file,(stat64 *)local_c0);
    if ((iVar9 < 0) || ((local_b0[0].ptr.field_1._0_4_ & 0xf000) != 0x4000)) {
      kj::heapString((String *)local_148,"output location is inaccessible or is not a directory",
                     0x35);
      (local_150->errorMessage).ptr.isSet = true;
      (local_150->errorMessage).ptr.field_1.value.content.ptr = (char *)local_148._0_8_;
      (local_150->errorMessage).ptr.field_1.value.content.size_ = local_148._8_8_;
      (local_150->errorMessage).ptr.field_1.value.content.disposer =
           (ArrayDisposer *)CONCAT71(local_138.ptr._1_7_,local_138.ptr.isSet);
      return local_150;
    }
    iVar9 = (*((this->disk).ptr)->_vptr_Filesystem[2])();
    local_d0.parts.ptr = (String *)CONCAT44(extraout_var,iVar9);
    pathText.content.size_ = sVar13;
    pathText.content.ptr = __file;
    kj::PathPtr::eval(&local_168,&local_d0,pathText);
    local_f0.ptr.isSet = true;
    local_f0.ptr.field_1.value.parts.ptr = local_168.parts.ptr;
    local_f0.ptr.field_1.value.parts.size_ = local_168.parts.size_;
    local_f0.ptr.field_1.value.parts.disposer = local_168.parts.disposer;
    local_168.parts.ptr = (String *)0x0;
    local_168.parts.size_ = 0;
    local_148._0_8_ = __s;
    local_148._8_8_ = uVar11;
    kj::Maybe<kj::Path>::Maybe(&local_138,&local_f0);
    __return_storage_ptr__ = local_150;
    pOVar3 = (this->outputs).builder.endPtr;
    if ((this->outputs).builder.pos == pOVar3) {
      pOVar4 = (this->outputs).builder.ptr;
      sVar13 = 4;
      if (pOVar3 != pOVar4) {
        sVar13 = ((long)pOVar3 - (long)pOVar4 >> 4) * 0x5555555555555556;
      }
      kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::setCapacity(&this->outputs,sVar13)
      ;
    }
    pRVar5 = (this->outputs).builder.pos;
    (pRVar5->name).ptr = (char *)local_148._0_8_;
    (pRVar5->name).size_ = local_148._8_8_;
    kj::Maybe<kj::Path>::Maybe(&pRVar5->dir,&local_138);
    uVar8 = local_138.ptr.field_1.value.parts.size_;
    uVar7 = local_138.ptr.field_1.value.parts.ptr;
    ppRVar2 = &(this->outputs).builder.pos;
    *ppRVar2 = *ppRVar2 + 1;
    if ((local_138.ptr.isSet == true) && (local_138.ptr.field_1.value.parts.ptr != (String *)0x0)) {
      local_138.ptr.field_1.value.parts.ptr = (String *)0x0;
      local_138.ptr.field_1.value.parts.size_ = 0;
      (**(local_138.ptr.field_1.value.parts.disposer)->_vptr_ArrayDisposer)
                (local_138.ptr.field_1.value.parts.disposer,uVar7,0x18,uVar8,uVar8,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
    }
    uVar8 = local_f0.ptr.field_1.value.parts.size_;
    uVar7 = local_f0.ptr.field_1.value.parts.ptr;
    if ((local_f0.ptr.isSet == true) && (local_f0.ptr.field_1.value.parts.ptr != (String *)0x0)) {
      local_f0.ptr.field_1.value.parts.ptr = (String *)0x0;
      local_f0.ptr.field_1.value.parts.size_ = 0;
      (**(local_f0.ptr.field_1.value.parts.disposer)->_vptr_ArrayDisposer)
                (local_f0.ptr.field_1.value.parts.disposer,uVar7,0x18,uVar8,uVar8,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
    }
    sVar13 = local_168.parts.size_;
    pSVar6 = local_168.parts.ptr;
    if (local_168.parts.ptr != (String *)0x0) {
      local_168.parts.ptr = (String *)0x0;
      local_168.parts.size_ = 0;
      (**(local_168.parts.disposer)->_vptr_ArrayDisposer)
                (local_168.parts.disposer,pSVar6,0x18,sVar13,sVar13,
                 kj::ArrayDisposer::Dispose_<kj::String>::destruct);
    }
  }
  (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addOutput(kj::StringPtr spec) {
    KJ_IF_SOME(split, spec.findFirst(':')) {
      kj::StringPtr dir = spec.slice(split + 1);
      auto plugin = spec.first(split);

      if (split == 1 && (dir.startsWith("/") || dir.startsWith("\\"))) {
        // The colon is the second character and is immediately followed by a slash or backslash.
        // So, the user passed something like `-o c:/foo`. Is this a request to run the C plugin
        // and output to `/foo`? Or are we on Windows, and is this a request to run the plugin
        // `c:/foo`?
        KJ_IF_SOME(split2, dir.findFirst(':')) {
          // There are two colons. The first ':' was the second char, and was followed by '/' or
          // '\', e.g.:
          //     capnp compile -o c:/foo.exe:bar
          //
          // In this case we can conclude that the second colon is actually meant to be the
          // plugin/location separator, and the first colon was simply signifying a drive letter.
          //
          // Proof by contradiction:
          // - Say that none of the colons were meant to be plugin/location separators; i.e. the
          //   whole argument is meant to be a plugin indicator and the location defaults to ".".
          //   -> In this case, the plugin path has two colons, which is not valid.
          //   -> CONTRADICTION
          // - Say that the first colon was meant to be the plugin/location separator.
          //   -> In this case, the second colon must be the drive letter separator for the
          //      output location.
          //   -> However, the output location begins with '/' or '\', which is not a drive letter.
          //   -> CONTRADICTION
          // - Say that there are more colons beyond the first two, and one of these is meant to
          //   be the plugin/location separator.
          //   -> In this case, the plugin path has two or more colons, which is not valid.
          //   -> CONTRADICTION
          //
          // We therefore conclude that the *second* colon is in fact the plugin/location separator.

          dir = dir.slice(split2 + 1);
          plugin = spec.first(split2 + 2);
#if _WIN32
        } else {
          // The user wrote something like:
          //
          //     capnp compile -o c:/foo/bar
          //
          // What does this mean? It depends on what system we're on. On a Unix system, the above
          // clearly is a request to run the `capnpc-c` plugin (perhaps to output C code) and write
          // to the directory /foo/bar. But on Windows, absolute paths do not start with '/', and
          // the above is actually a request to run the plugin `c:/foo/bar`, outputting to the
          // current directory.

          outputs.add(OutputDirective { spec.asArray(), kj::none });
          return true;
#endif
        }
      }

      struct stat stats;
      if (stat(dir.cStr(), &stats) < 0 || !S_ISDIR(stats.st_mode)) {
        return "output location is inaccessible or is not a directory";
      }
      outputs.add(OutputDirective { plugin, disk->getCurrentPath().evalNative(dir) });
    }